

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# unit-math.cc
# Opt level: O1

void math_sin_cos_pi_test(void)

{
  uint uVar1;
  uint uVar2;
  double dVar3;
  double dVar4;
  
  uVar1 = 1;
  acutest_check_(1,
                 "/workspace/llm4binary/github/license_c_cmakelists/syoyo[P]tinyusdz/tests/unit/unit-math.cc"
                 ,0x36,"%s",
                 "math::is_close(math::cos_pi(315.0/180.0), -math::sin_pi(315.0/180.0), 0.0)");
  acutest_message_("cos(315) = %lf, sin(315) = %lf",0x3fe6a09e667f3bcd,0xbfe6a09e667f3bcd);
  acutest_check_(1,
                 "/workspace/llm4binary/github/license_c_cmakelists/syoyo[P]tinyusdz/tests/unit/unit-math.cc"
                 ,0x39,"%s",
                 "math::is_close(math::cos_pi(225.0/180.0), math::sin_pi(225.0/180.0), 0.0)");
  acutest_message_("cos(225) = %lf, sin(225) = %lf",0xbfe6a09e667f3bcd,0xbfe6a09e667f3bcd);
  acutest_check_(1,
                 "/workspace/llm4binary/github/license_c_cmakelists/syoyo[P]tinyusdz/tests/unit/unit-math.cc"
                 ,0x3c,"%s",
                 "math::is_close(-math::cos_pi(135.0/180.0), math::sin_pi(135.0/180.0), 0.0)");
  acutest_message_("cos(135) = %lf, sin(135) = %lf",0xbfe6a09e667f3bcd,0x3fe6a09e667f3bcd);
  acutest_check_(1,
                 "/workspace/llm4binary/github/license_c_cmakelists/syoyo[P]tinyusdz/tests/unit/unit-math.cc"
                 ,0x3f,"%s",
                 "math::is_close(math::cos_pi(45.0/180.0), math::sin_pi(45.0/180.0), 0.0)");
  acutest_message_("cos(45) = %lf, sin(45) = %lf",0x3fe6a09e667f3bcd,0x3fe6a09e667f3bcd);
  dVar3 = tinyusdz::math::sin_pi_imp<double>(-0.25);
  dVar4 = dVar3 + 0.7071067811865476;
  uVar2 = 1;
  if ((dVar4 != 0.0) || (NAN(dVar4))) {
    dVar3 = ABS(dVar3);
    if (dVar3 <= 0.7071067811865476) {
      dVar3 = 0.7071067811865476;
    }
    uVar2 = (uint)(ABS(dVar4) <= dVar3 * 0.0);
  }
  acutest_check_(uVar2,
                 "/workspace/llm4binary/github/license_c_cmakelists/syoyo[P]tinyusdz/tests/unit/unit-math.cc"
                 ,0x42,"%s",
                 "math::is_close(math::cos_pi(-45.0/180.0), -math::sin_pi(-45.0/180.0), 0.0)");
  dVar3 = tinyusdz::math::sin_pi_imp<double>(-0.25);
  acutest_message_("cos(-45) = %lf, sin(-45) = %lf",0x3fe6a09e667f3bcd,dVar3);
  dVar3 = tinyusdz::math::sin_pi_imp<double>(-0.75);
  dVar4 = -0.7071067811865476 - dVar3;
  if ((dVar4 != 0.0) || (NAN(dVar4))) {
    dVar3 = ABS(dVar3);
    if (dVar3 <= 0.7071067811865476) {
      dVar3 = 0.7071067811865476;
    }
    uVar1 = (uint)(ABS(dVar4) <= dVar3 * 0.0);
  }
  acutest_check_(uVar1,
                 "/workspace/llm4binary/github/license_c_cmakelists/syoyo[P]tinyusdz/tests/unit/unit-math.cc"
                 ,0x45,"%s",
                 "math::is_close(math::cos_pi(-135.0/180.0), math::sin_pi(-135.0/180.0), 0.0)");
  dVar3 = tinyusdz::math::sin_pi_imp<double>(-0.75);
  acutest_message_("cos(-135) = %lf, sin(-135) = %lf",0xbfe6a09e667f3bcd,dVar3);
  dVar3 = tinyusdz::math::sin_pi_imp<double>(-1.25);
  dVar4 = 0.7071067811865476 - dVar3;
  uVar1 = 1;
  uVar2 = 1;
  if ((dVar4 != 0.0) || (NAN(dVar4))) {
    dVar3 = ABS(dVar3);
    if (dVar3 <= 0.7071067811865476) {
      dVar3 = 0.7071067811865476;
    }
    uVar2 = (uint)(ABS(dVar4) <= dVar3 * 0.0);
  }
  acutest_check_(uVar2,
                 "/workspace/llm4binary/github/license_c_cmakelists/syoyo[P]tinyusdz/tests/unit/unit-math.cc"
                 ,0x48,"%s",
                 "math::is_close(-math::cos_pi(-225.0/180.0), math::sin_pi(-225.0/180.0), 0.0)");
  dVar3 = tinyusdz::math::sin_pi_imp<double>(-1.25);
  acutest_message_("cos(-225) = %lf, sin(-225) = %lf",0xbfe6a09e667f3bcd,dVar3);
  dVar3 = tinyusdz::math::sin_pi_imp<double>(-1.75);
  dVar4 = 0.7071067811865476 - dVar3;
  if ((dVar4 != 0.0) || (NAN(dVar4))) {
    dVar3 = ABS(dVar3);
    if (dVar3 <= 0.7071067811865476) {
      dVar3 = 0.7071067811865476;
    }
    uVar1 = (uint)(ABS(dVar4) <= dVar3 * 0.0);
  }
  acutest_check_(uVar1,
                 "/workspace/llm4binary/github/license_c_cmakelists/syoyo[P]tinyusdz/tests/unit/unit-math.cc"
                 ,0x4b,"%s",
                 "math::is_close(math::cos_pi(-315.0/180.0), math::sin_pi(-315.0/180.0), 0.0)");
  tinyusdz::math::sin_pi_imp<double>(-1.75);
  acutest_message_("cos(-315) = %lf, sin(-315) = %lf",0x3fe6a09e667f3bcd);
  uVar1 = 1;
  acutest_check_(1,
                 "/workspace/llm4binary/github/license_c_cmakelists/syoyo[P]tinyusdz/tests/unit/unit-math.cc"
                 ,0x4f,"%s","math::is_close(math::cos_pi(90.0/180.0), 0.0, 0.0)");
  acutest_check_(1,
                 "/workspace/llm4binary/github/license_c_cmakelists/syoyo[P]tinyusdz/tests/unit/unit-math.cc"
                 ,0x50,"%s","math::is_close(math::cos_pi(270.0/180.0), 0.0, 0.0)");
  acutest_check_(1,
                 "/workspace/llm4binary/github/license_c_cmakelists/syoyo[P]tinyusdz/tests/unit/unit-math.cc"
                 ,0x51,"%s","math::is_close(math::cos_pi(-90.0/180.0), 0.0, 0.0)");
  acutest_check_(1,
                 "/workspace/llm4binary/github/license_c_cmakelists/syoyo[P]tinyusdz/tests/unit/unit-math.cc"
                 ,0x52,"%s","math::is_close(math::cos_pi(-270.0/180.0), 0.0, 0.0)");
  acutest_check_(1,
                 "/workspace/llm4binary/github/license_c_cmakelists/syoyo[P]tinyusdz/tests/unit/unit-math.cc"
                 ,0x53,"%s","math::is_close(math::sin_pi(0.0), 0.0, 0.0)");
  acutest_check_(1,
                 "/workspace/llm4binary/github/license_c_cmakelists/syoyo[P]tinyusdz/tests/unit/unit-math.cc"
                 ,0x54,"%s","math::is_close(math::sin_pi(360.0/180.0), 0.0, 0.0)");
  acutest_check_(1,
                 "/workspace/llm4binary/github/license_c_cmakelists/syoyo[P]tinyusdz/tests/unit/unit-math.cc"
                 ,0x55,"%s","math::is_close(math::sin_pi(180.0/180.0), 0.0, 0.0)");
  dVar3 = tinyusdz::math::sin_pi_imp<double>(-1.0);
  uVar2 = 1;
  if ((dVar3 != 0.0) || (NAN(dVar3))) {
    dVar3 = ABS(dVar3);
    dVar4 = dVar3;
    if (dVar3 <= 0.0) {
      dVar4 = 0.0;
    }
    uVar2 = (uint)(dVar3 <= dVar4 * 0.0);
  }
  acutest_check_(uVar2,
                 "/workspace/llm4binary/github/license_c_cmakelists/syoyo[P]tinyusdz/tests/unit/unit-math.cc"
                 ,0x56,"%s","math::is_close(math::sin_pi(-180.0/180.0), 0.0, 0.0)");
  dVar3 = tinyusdz::math::sin_pi_imp<double>(-2.0);
  if ((dVar3 != 0.0) || (NAN(dVar3))) {
    dVar3 = ABS(dVar3);
    dVar4 = dVar3;
    if (dVar3 <= 0.0) {
      dVar4 = 0.0;
    }
    uVar1 = (uint)(dVar3 <= dVar4 * 0.0);
  }
  acutest_check_(uVar1,
                 "/workspace/llm4binary/github/license_c_cmakelists/syoyo[P]tinyusdz/tests/unit/unit-math.cc"
                 ,0x57,"%s","math::is_close(math::sin_pi(-360.0/180.0), 0.0, 0.0)");
  return;
}

Assistant:

void math_sin_cos_pi_test(void) {

  // should exactly match(whereas std::sin/cos is not)
  TEST_CHECK(math::is_close(math::cos_pi(315.0/180.0), -math::sin_pi(315.0/180.0), 0.0));
  TEST_MSG("cos(315) = %lf, sin(315) = %lf", math::cos_pi(315.0/180.0), math::sin_pi(315.0/180.0));

  TEST_CHECK(math::is_close(math::cos_pi(225.0/180.0), math::sin_pi(225.0/180.0), 0.0));
  TEST_MSG("cos(225) = %lf, sin(225) = %lf", math::cos_pi(225.0/180.0), math::sin_pi(225.0/180.0));

  TEST_CHECK(math::is_close(-math::cos_pi(135.0/180.0), math::sin_pi(135.0/180.0), 0.0));
  TEST_MSG("cos(135) = %lf, sin(135) = %lf", math::cos_pi(135.0/180.0), math::sin_pi(135.0/180.0));

  TEST_CHECK(math::is_close(math::cos_pi(45.0/180.0), math::sin_pi(45.0/180.0), 0.0));
  TEST_MSG("cos(45) = %lf, sin(45) = %lf", math::cos_pi(45.0/180.0), math::sin_pi(45.0/180.0));

  TEST_CHECK(math::is_close(math::cos_pi(-45.0/180.0), -math::sin_pi(-45.0/180.0), 0.0));
  TEST_MSG("cos(-45) = %lf, sin(-45) = %lf", math::cos_pi(-45.0/180.0), math::sin_pi(-45.0/180.0));

  TEST_CHECK(math::is_close(math::cos_pi(-135.0/180.0), math::sin_pi(-135.0/180.0), 0.0));
  TEST_MSG("cos(-135) = %lf, sin(-135) = %lf", math::cos_pi(-135.0/180.0), math::sin_pi(-135.0/180.0));

  TEST_CHECK(math::is_close(-math::cos_pi(-225.0/180.0), math::sin_pi(-225.0/180.0), 0.0));
  TEST_MSG("cos(-225) = %lf, sin(-225) = %lf", math::cos_pi(-225.0/180.0), math::sin_pi(-225.0/180.0));

  TEST_CHECK(math::is_close(math::cos_pi(-315.0/180.0), math::sin_pi(-315.0/180.0), 0.0));
  TEST_MSG("cos(-315) = %lf, sin(-315) = %lf", math::cos_pi(-315.0/180.0), math::sin_pi(-315.0/180.0));

  // must be exactly zero
  TEST_CHECK(math::is_close(math::cos_pi(90.0/180.0), 0.0, 0.0));
  TEST_CHECK(math::is_close(math::cos_pi(270.0/180.0), 0.0, 0.0));
  TEST_CHECK(math::is_close(math::cos_pi(-90.0/180.0), 0.0, 0.0));
  TEST_CHECK(math::is_close(math::cos_pi(-270.0/180.0), 0.0, 0.0));
  TEST_CHECK(math::is_close(math::sin_pi(0.0), 0.0, 0.0));
  TEST_CHECK(math::is_close(math::sin_pi(360.0/180.0), 0.0, 0.0));
  TEST_CHECK(math::is_close(math::sin_pi(180.0/180.0), 0.0, 0.0));
  TEST_CHECK(math::is_close(math::sin_pi(-180.0/180.0), 0.0, 0.0));
  TEST_CHECK(math::is_close(math::sin_pi(-360.0/180.0), 0.0, 0.0));
}